

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::addWarning(ConfigData *config,string *_warning)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::operator==(_warning,"NoAssertions");
  if (bVar1) {
    *(undefined1 *)&config->warnings = (char)config->warnings | NoAssertions;
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Unrecognised warning: \'",_warning);
  std::operator+(&local_38,&bStack_58,'\'');
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void addWarning( ConfigData& config, std::string const& _warning ) {
        if( _warning == "NoAssertions" )
            config.warnings = static_cast<WarnAbout::What>( config.warnings | WarnAbout::NoAssertions );
        else
            throw std::runtime_error( "Unrecognised warning: '" + _warning + '\'' );
    }